

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

int __thiscall Pathie::Path::stat(Path *this,char *__file,stat *__buf)

{
  int iVar1;
  stat *__buf_00;
  ErrnoError *this_00;
  int *piVar2;
  string nstr;
  
  __buf_00 = (stat *)malloc(0x90);
  utf8_to_filename(&nstr,&this->m_path);
  iVar1 = ::stat(nstr._M_dataplus._M_p,__buf_00);
  if (-1 < iVar1) {
    std::__cxx11::string::_M_dispose();
    return (int)__buf_00;
  }
  this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar2 = __errno_location();
  ErrnoError::ErrnoError(this_00,*piVar2);
  __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
}

Assistant:

struct stat* Path::stat() const
{
  struct stat* s = (struct stat*) malloc(sizeof(struct stat));
  std::string nstr = native();

  if (::stat(nstr.c_str(), s) < 0)
    throw(Pathie::ErrnoError(errno));

  return s;
}